

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_cons_viscous_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,REF_DBL re,
          REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t __size;
  double rho;
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  REF_NODE pRVar5;
  REF_GLOB *pRVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  uint uVar10;
  REF_DBL *hessian;
  REF_DBL *pRVar11;
  REF_DBL *pRVar12;
  undefined8 uVar13;
  int iVar14;
  double *pdVar15;
  ulong uVar16;
  REF_DBL *pRVar17;
  long lVar18;
  char *pcVar19;
  long lVar20;
  ulong uVar21;
  REF_DBL reference_temp_k;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  double dVar26;
  REF_DBL mu_t;
  REF_DBL *local_d0;
  REF_DBL *local_c8;
  double local_88;
  double local_80;
  REF_DBL *local_78;
  REF_DBL local_70;
  REF_DBL *local_68;
  undefined8 uStack_60;
  double local_50;
  undefined1 local_48 [16];
  
  pRVar5 = ref_grid->node;
  uVar21 = (ulong)(uint)pRVar5->max;
  if (pRVar5->max < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbca,
           "ref_metric_cons_viscous_g","malloc rhou1star of REF_DBL negative");
    return 1;
  }
  __size = uVar21 * 0x30;
  local_70 = reference_temp;
  local_68 = g;
  hessian = (REF_DBL *)malloc(__size);
  if (hessian == (REF_DBL *)0x0) {
    pcVar19 = "malloc rhou1star of REF_DBL NULL";
    uVar13 = 0xbca;
    goto LAB_001c9ef2;
  }
  iVar14 = ldim / 2;
  if (uVar21 == 0) {
    local_d0 = (REF_DBL *)malloc(__size);
    if (local_d0 == (REF_DBL *)0x0) goto LAB_001c9dc0;
    local_c8 = (REF_DBL *)malloc(__size);
    if (local_c8 == (REF_DBL *)0x0) goto LAB_001c9de6;
    local_78 = (REF_DBL *)malloc(__size);
    if (local_78 == (REF_DBL *)0x0) goto LAB_001c9e0c;
    pRVar11 = (REF_DBL *)malloc(0);
    if (pRVar11 != (REF_DBL *)0x0) goto LAB_001c9d73;
  }
  else {
    uVar16 = uVar21 * 6 & 0xffffffff;
    memset(hessian,0,uVar16 * 8);
    local_d0 = (REF_DBL *)malloc(__size);
    if (local_d0 == (REF_DBL *)0x0) {
LAB_001c9dc0:
      pcVar19 = "malloc rhou2star of REF_DBL NULL";
      uVar13 = 0xbcb;
      goto LAB_001c9ef2;
    }
    memset(local_d0,0,uVar16 * 8);
    local_c8 = (REF_DBL *)malloc(__size);
    if (local_c8 == (REF_DBL *)0x0) {
LAB_001c9de6:
      pcVar19 = "malloc rhou3star of REF_DBL NULL";
      uVar13 = 0xbcc;
      goto LAB_001c9ef2;
    }
    memset(local_c8,0,uVar16 << 3);
    local_78 = (REF_DBL *)malloc(__size);
    if (local_78 == (REF_DBL *)0x0) {
LAB_001c9e0c:
      pcVar19 = "malloc rhoestar of REF_DBL NULL";
      uVar13 = 0xbcd;
      goto LAB_001c9ef2;
    }
    memset(local_78,0,(uVar21 * 6 & 0xffffffff) << 3);
    pRVar11 = (REF_DBL *)calloc(1,uVar21 * 8);
    if (pRVar11 != (REF_DBL *)0x0) {
      pRVar6 = pRVar5->global;
      pRVar12 = prim_dual + (long)iVar14 + 1;
      uVar16 = 0;
      do {
        if (-1 < pRVar6[uVar16]) {
          pRVar11[uVar16] = *pRVar12;
        }
        uVar16 = uVar16 + 1;
        pRVar12 = pRVar12 + ldim;
      } while (uVar21 != uVar16);
LAB_001c9d73:
      uVar10 = ref_recon_signed_hessian(ref_grid,pRVar11,hessian,reconstruction);
      if (uVar10 == 0) {
        iVar4 = pRVar5->max;
        if (0 < (long)iVar4) {
          pRVar6 = pRVar5->global;
          pRVar12 = prim_dual + (long)iVar14 + 2;
          lVar18 = 0;
          do {
            if (-1 < pRVar6[lVar18]) {
              pRVar11[lVar18] = *pRVar12;
            }
            lVar18 = lVar18 + 1;
            pRVar12 = pRVar12 + ldim;
          } while (iVar4 != lVar18);
        }
        uVar10 = ref_recon_signed_hessian(ref_grid,pRVar11,local_d0,reconstruction);
        if (uVar10 == 0) {
          iVar4 = pRVar5->max;
          if (0 < (long)iVar4) {
            pRVar6 = pRVar5->global;
            pRVar12 = prim_dual + (long)iVar14 + 3;
            lVar18 = 0;
            do {
              if (-1 < pRVar6[lVar18]) {
                pRVar11[lVar18] = *pRVar12;
              }
              lVar18 = lVar18 + 1;
              pRVar12 = pRVar12 + ldim;
            } while (iVar4 != lVar18);
          }
          uVar10 = ref_recon_signed_hessian(ref_grid,pRVar11,local_c8,reconstruction);
          pRVar12 = local_78;
          if (uVar10 == 0) {
            iVar4 = pRVar5->max;
            if (0 < (long)iVar4) {
              pRVar6 = pRVar5->global;
              pRVar17 = prim_dual + (long)iVar14 + 4;
              lVar18 = 0;
              do {
                if (-1 < pRVar6[lVar18]) {
                  pRVar11[lVar18] = *pRVar17;
                }
                lVar18 = lVar18 + 1;
                pRVar17 = pRVar17 + ldim;
              } while (iVar4 != lVar18);
            }
            uVar10 = ref_recon_signed_hessian(ref_grid,pRVar11,local_78,reconstruction);
            if (uVar10 == 0) {
              free(pRVar11);
              iVar14 = pRVar5->max;
              if (0 < iVar14) {
                pRVar11 = prim_dual + 5;
                pdVar15 = local_68 + 4;
                lVar20 = 5;
                lVar18 = 0;
                reference_temp_k = local_70;
                do {
                  if (-1 < pRVar5->global[lVar18]) {
                    rho = pRVar11[-5];
                    local_68 = (REF_DBL *)pRVar11[-4];
                    uStack_60 = 0;
                    dVar8 = pRVar11[-3];
                    dVar9 = pRVar11[-2];
                    local_80 = pRVar11[-1] / 0.3999999999999999;
                    uVar10 = viscosity_law((pRVar11[-1] * 1.4) / rho,reference_temp_k,&local_88);
                    if (uVar10 != 0) {
                      pcVar19 = "sutherlands";
                      uVar13 = 0xbee;
                      goto LAB_001ca017;
                    }
                    if ((ldim & 0xfffffffeU) == 0xc) {
                      uVar10 = ref_phys_mut_sa(*pRVar11,rho,local_88 / rho,&local_50);
                      if (uVar10 != 0) {
                        pcVar19 = "eddy viscosity";
                        uVar13 = 0xbf2;
                        goto LAB_001ca017;
                      }
                      auVar25._8_8_ = local_50;
                      auVar25._0_8_ = local_88;
                      auVar25 = divpd(auVar25,_DAT_0021fce0);
                      local_48._8_4_ = auVar25._8_4_;
                      local_48._0_8_ = auVar25._8_8_ + auVar25._0_8_;
                      local_48._12_4_ = auVar25._12_4_;
                      local_88 = local_88 + local_50;
                    }
                    else {
                      local_48._8_8_ = 0;
                      local_48._0_8_ = local_88 / 0.2879999999999999;
                    }
                    dVar26 = dVar9 * dVar9 + (double)local_68 * (double)local_68 + dVar8 * dVar8;
                    dVar1 = local_78[lVar20 + -2];
                    dVar2 = local_78[lVar20 + -5];
                    dVar3 = local_78[lVar20];
                    dVar7 = (((double)local_48._0_8_ * (mach / re)) / rho) * (dVar2 + dVar1 + dVar3)
                    ;
                    local_88 = local_88 * (mach / re);
                    dVar22 = (local_88 * 0.3333333333333333) / rho;
                    dVar24 = (dVar9 * local_78[lVar20 + -3] +
                              dVar8 * local_78[lVar20 + -4] +
                              (double)local_68 * 3.0 * dVar3 +
                              (double)local_68 * 4.0 * dVar2 + (double)local_68 * 3.0 * dVar1 +
                             hessian[lVar20] * 3.0 +
                             hessian[lVar20 + -5] * 4.0 + hessian[lVar20 + -2] * 3.0 +
                             local_d0[lVar20 + -4] + local_c8[lVar20 + -3]) * dVar22;
                    dVar23 = dVar22 * (local_78[lVar20 + -1] * dVar9 +
                                       dVar3 * dVar8 * 3.0 +
                                       dVar1 * dVar8 * 4.0 +
                                       local_78[lVar20 + -4] * (double)local_68 +
                                       dVar8 * 3.0 * dVar2 +
                                      local_d0[lVar20] * 3.0 +
                                      local_d0[lVar20 + -2] * 4.0 +
                                      local_d0[lVar20 + -5] * 3.0 + hessian[lVar20 + -4] +
                                      local_c8[lVar20 + -1]);
                    dVar22 = dVar22 * (local_c8[lVar20] * 4.0 +
                                       local_c8[lVar20 + -2] * 3.0 +
                                       local_c8[lVar20 + -5] * 3.0 +
                                       hessian[lVar20 + -3] + local_d0[lVar20 + -1] +
                                      dVar9 * 4.0 * dVar3 +
                                      dVar9 * 3.0 * dVar1 +
                                      dVar9 * 3.0 * dVar2 +
                                      local_78[lVar20 + -3] * (double)local_68 +
                                      dVar8 * local_78[lVar20 + -1]);
                    pdVar15[-4] = (dVar26 - (rho * 0.5 * dVar26 + local_80) / rho) * dVar7 +
                                  dVar22 * -dVar9 + (dVar23 * -dVar8 - (double)local_68 * dVar24) +
                                  pdVar15[-4];
                    pdVar15[-3] = -(double)local_68 * dVar7 + dVar24 + pdVar15[-3];
                    pdVar15[-2] = pdVar15[-2] + (dVar23 - dVar7 * dVar8);
                    pdVar15[-1] = pdVar15[-1] + (dVar22 - dVar7 * dVar9);
                    *pdVar15 = dVar7 + *pdVar15;
                    iVar14 = pRVar5->max;
                    pRVar12 = local_78;
                    reference_temp_k = local_70;
                  }
                  lVar18 = lVar18 + 1;
                  pdVar15 = pdVar15 + 5;
                  lVar20 = lVar20 + 6;
                  pRVar11 = pRVar11 + ldim;
                } while (lVar18 < iVar14);
              }
              free(pRVar12);
              free(local_c8);
              free(local_d0);
              free(hessian);
              return 0;
            }
            pcVar19 = "h4";
            uVar13 = 0xbe3;
          }
          else {
            pcVar19 = "h3";
            uVar13 = 0xbde;
          }
        }
        else {
          pcVar19 = "h2";
          uVar13 = 0xbd9;
        }
      }
      else {
        pcVar19 = "h1";
        uVar13 = 0xbd4;
      }
LAB_001ca017:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             uVar13,"ref_metric_cons_viscous_g",(ulong)uVar10,pcVar19);
      return uVar10;
    }
  }
  pcVar19 = "malloc lam of REF_DBL NULL";
  uVar13 = 0xbce;
LAB_001c9ef2:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar13,
         "ref_metric_cons_viscous_g",pcVar19);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_viscous_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node;
  REF_INT nequ;
  REF_DBL *lam, *rhou1star, *rhou2star, *rhou3star, *rhoestar;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu, u1, u2, u3, q2, e;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;
  REF_DBL frhou1, frhou2, frhou3, frhoe;
  REF_INT xx = 0, xy = 1, xz = 2, yy = 3, yz = 4, zz = 5;

  nequ = ldim / 2;

  ref_malloc_init(rhou1star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou2star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou3star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhoestar, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);

  var = 1;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou1star, reconstruction), "h1");
  var = 2;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou2star, reconstruction), "h2");
  var = 3;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou3star, reconstruction), "h3");
  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhoestar, reconstruction), "h4");
  ref_free(lam);

  each_ref_node_valid_node(ref_node, node) {
    rho = prim_dual[0 + ldim * node];
    u1 = prim_dual[1 + ldim * node];
    u2 = prim_dual[2 + ldim * node];
    u3 = prim_dual[3 + ldim * node];
    q2 = u1 * u1 + u2 * u2 + u3 * u3;
    e = prim_dual[4 + ldim * node] / (gamma - 1.0) + 0.5 * rho * q2;
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    mu *= mach / re;
    thermal_conductivity *= mach / re;

    frhou1 = 4.0 * rhou1star[xx + 6 * node] + 3.0 * rhou1star[yy + 6 * node] +
             3.0 * rhou1star[zz + 6 * node] + rhou2star[xy + 6 * node] +
             rhou3star[xz + 6 * node];
    frhou1 += 4.0 * u1 * rhoestar[xx + 6 * node] +
              3.0 * u1 * rhoestar[yy + 6 * node] +
              3.0 * u1 * rhoestar[zz + 6 * node] +
              u2 * rhoestar[xy + 6 * node] + u3 * rhoestar[xz + 6 * node];
    frhou1 *= (1.0 / 3.0) * mu / rho;

    frhou2 = rhou1star[xy + 6 * node] + 3.0 * rhou2star[xx + 6 * node] +
             4.0 * rhou2star[yy + 6 * node] + 3.0 * rhou2star[zz + 6 * node] +
             rhou3star[yz + 6 * node];
    frhou2 += u1 * rhoestar[xy + 6 * node] +
              3.0 * u2 * rhoestar[xx + 6 * node] +
              4.0 * u2 * rhoestar[yy + 6 * node] +
              3.0 * u2 * rhoestar[zz + 6 * node] + u3 * rhoestar[yz + 6 * node];
    frhou2 *= (1.0 / 3.0) * mu / rho;

    frhou3 = rhou1star[xz + 6 * node] + rhou2star[yz + 6 * node] +
             3.0 * rhou3star[xx + 6 * node] + 3.0 * rhou3star[yy + 6 * node] +
             4.0 * rhou3star[zz + 6 * node];
    frhou3 += u1 * rhoestar[xz + 6 * node] + u2 * rhoestar[yz + 6 * node] +
              3.0 * u3 * rhoestar[xx + 6 * node] +
              3.0 * u3 * rhoestar[yy + 6 * node] +
              4.0 * u3 * rhoestar[zz + 6 * node];
    frhou3 *= (1.0 / 3.0) * mu / rho;

    frhoe = rhoestar[xx + 6 * node] + rhoestar[yy + 6 * node] +
            rhoestar[zz + 6 * node];
    frhoe *= thermal_conductivity / rho;
    /* fun3d e has density in it */
    g[0 + 5 * node] +=
        -u1 * frhou1 - u2 * frhou2 - u3 * frhou3 + (q2 - e / rho) * frhoe;
    g[1 + 5 * node] += frhou1 - u1 * frhoe;
    g[2 + 5 * node] += frhou2 - u2 * frhoe;
    g[3 + 5 * node] += frhou3 - u3 * frhoe;
    g[4 + 5 * node] += frhoe;
  }

  ref_free(rhoestar);
  ref_free(rhou3star);
  ref_free(rhou2star);
  ref_free(rhou1star);

  return REF_SUCCESS;
}